

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<std::__cxx11::string>
          (string *__return_storage_ptr__,tinyformat *this,string *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1a0 [376];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  format<std::__cxx11::string>((ostream *)local_1a0,*(char **)this,fmt);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const std::string &fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt.c_str(), args...);
    return oss.str();
}